

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messagebox.cpp
# Opt level: O2

void __thiscall DMessageBoxMenu::Drawer(DMessageBoxMenu *this)

{
  int iVar1;
  uint uVar2;
  EColorRange EVar3;
  FFont *pFVar4;
  DFrameBuffer *pDVar5;
  EColorRange *pEVar6;
  char *pcVar7;
  FBrokenLines *pFVar8;
  FBrokenLines *pFVar9;
  long lVar10;
  EColorRange *pEVar11;
  int iVar12;
  
  iVar1 = SmallFont->FontHeight;
  pFVar9 = this->mMessage;
  if (pFVar9 == (FBrokenLines *)0x0) {
    iVar12 = 100;
  }
  else {
    iVar12 = 100;
    for (pFVar8 = pFVar9; -1 < pFVar8->Width; pFVar8 = pFVar8 + 1) {
      iVar12 = iVar12 + iVar1 / -2;
    }
    lVar10 = 8;
    while( true ) {
      uVar2 = *(uint *)((long)pFVar9 + lVar10 + -8);
      if ((int)uVar2 < 0) break;
      DCanvas::DrawText((DCanvas *)screen,SmallFont,0xb,0xa0 - (uVar2 >> 1),iVar12,
                        *(char **)((long)&pFVar9->Width + lVar10),0x40001390,1,0);
      iVar12 = iVar12 + iVar1;
      pFVar9 = this->mMessage;
      lVar10 = lVar10 + 0x10;
    }
  }
  if (this->mMessageMode == 0) {
    iVar12 = iVar12 + iVar1;
    this->mMouseY = iVar12;
    pDVar5 = screen;
    pFVar4 = SmallFont;
    pEVar11 = &OptionSettings.mFontColor;
    pEVar6 = pEVar11;
    if (this->messageSelection == 0) {
      pEVar6 = &OptionSettings.mFontColorSelection;
    }
    EVar3 = *pEVar6;
    pcVar7 = FStringTable::operator[](&GStrings,"TXT_YES");
    DCanvas::DrawText((DCanvas *)pDVar5,pFVar4,EVar3,0xa0,iVar12,pcVar7,0x40001390,1,0);
    pDVar5 = screen;
    pFVar4 = SmallFont;
    if (this->messageSelection == 1) {
      pEVar11 = &OptionSettings.mFontColorSelection;
    }
    EVar3 = *pEVar11;
    pcVar7 = FStringTable::operator[](&GStrings,"TXT_NO");
    DCanvas::DrawText((DCanvas *)pDVar5,pFVar4,EVar3,0xa0,iVar1 + iVar12 + 1,pcVar7,0x40001390,1,0);
    if ((-1 < this->messageSelection) && (DMenu::MenuTime % 8 < 6)) {
      DCanvas::DrawText((DCanvas *)screen,ConFont,OptionSettings.mFontColorSelection,
                        CleanXfac * -10 + (screen->super_DSimpleCanvas).super_DCanvas.Width / 2,
                        (this->messageSelection * (iVar1 + 1) + iVar1 / 2 + iVar12 + -0x69) *
                        CleanYfac + (screen->super_DSimpleCanvas).super_DCanvas.Height / 2,"\r",
                        0x400013b8,CleanXfac << 3,0x400013b9,CleanYfac << 3,0);
    }
  }
  return;
}

Assistant:

void DMessageBoxMenu::Drawer ()
{
	int i, y;
	PalEntry fade = 0;

	int fontheight = SmallFont->GetHeight();
	//V_SetBorderNeedRefresh();
	//ST_SetNeedRefresh();

	y = 100;

	if (mMessage != NULL)
	{
		for (i = 0; mMessage[i].Width >= 0; i++)
			y -= SmallFont->GetHeight () / 2;

		for (i = 0; mMessage[i].Width >= 0; i++)
		{
			screen->DrawText (SmallFont, CR_UNTRANSLATED, 160 - mMessage[i].Width/2, y, mMessage[i].Text,
				DTA_Clean, true, TAG_DONE);
			y += fontheight;
		}
	}

	if (mMessageMode == 0)
	{
		y += fontheight;
		mMouseY = y;
		screen->DrawText(SmallFont, 
			messageSelection == 0? OptionSettings.mFontColorSelection : OptionSettings.mFontColor, 
			160, y, GStrings["TXT_YES"], DTA_Clean, true, TAG_DONE);
		screen->DrawText(SmallFont, 
			messageSelection == 1? OptionSettings.mFontColorSelection : OptionSettings.mFontColor, 
			160, y + fontheight + 1, GStrings["TXT_NO"], DTA_Clean, true, TAG_DONE);

		if (messageSelection >= 0)
		{
			if ((DMenu::MenuTime%8) < 6)
			{
				screen->DrawText(ConFont, OptionSettings.mFontColorSelection,
					(150 - 160) * CleanXfac + screen->GetWidth() / 2,
					(y + (fontheight + 1) * messageSelection - 100 + fontheight/2 - 5) * CleanYfac + screen->GetHeight() / 2,
					"\xd",
					DTA_CellX, 8 * CleanXfac,
					DTA_CellY, 8 * CleanYfac,
					TAG_DONE);
			}
		}
	}
}